

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void indigox::Options::AssignElectrons::Reset(void)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde0;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffde8;
  string *local_1f0;
  allocator local_154;
  allocator local_153;
  allocator local_152;
  allocator local_151;
  allocator local_150;
  allocator local_14f;
  allocator local_14e;
  allocator local_14d [20];
  allocator local_139;
  string *local_138;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  string *local_10;
  undefined8 local_8;
  
  ALGORITHM = FPT;
  std::__cxx11::string::operator=((string *)ATOM_ENERGY_FILE_abi_cxx11_,"atomenergies_def2svpd.txt")
  ;
  std::__cxx11::string::operator=((string *)BOND_ENERGY_FILE_abi_cxx11_,"bondenergies_def2svpd.txt")
  ;
  INF = std::numeric_limits<unsigned_int>::max();
  MAXIMUM_BOND_ORDER = 3;
  USE_ELECTRON_PAIRS = true;
  AUTO_USE_ELECTRON_PAIRS = true;
  USE_CHARGED_BOND_ENERGIES = false;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x12a1ed);
  local_138 = local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"H",&local_139);
  local_138 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"C",local_14d);
  local_138 = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"N",&local_14e);
  local_138 = local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"O",&local_14f);
  local_138 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"S",&local_150);
  local_138 = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"P",&local_151);
  local_138 = local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"F",&local_152);
  local_138 = local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Cl",&local_153);
  local_138 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Br",&local_154);
  local_10 = local_130;
  local_8 = 9;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffde8);
  local_1f0 = (string *)&local_10;
  do {
    local_1f0 = local_1f0 + -0x20;
    std::__cxx11::string::~string(local_1f0);
  } while (local_1f0 != local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_154);
  std::allocator<char>::~allocator((allocator<char> *)&local_153);
  std::allocator<char>::~allocator((allocator<char> *)&local_152);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::~allocator((allocator<char> *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e);
  std::allocator<char>::~allocator((allocator<char> *)local_14d);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  HIGHEST_MAGNITUDE_CHARGE = 0;
  ALLOW_CHARGED_CARBON = true;
  MAXIMUM_RESULT_COUNT = 0;
  PREPLACE_ELECTRONS = true;
  AStar::Reset();
  FPT::Reset();
  LocalOptimisation::Reset();
  return;
}

Assistant:

void assign_::Reset() {
  // AssignElectron general
  assign_::ALGORITHM = DFT_ASSIGNELECTRON_ALGORITHM;
  assign_::ATOM_ENERGY_FILE = DFT_ASSIGNELECTRON_ATOM_FILE;
  assign_::BOND_ENERGY_FILE = DFT_ASSIGNELECTRON_BOND_FILE;
  assign_::INF = DFT_ASSIGNELECTRON_INFINITY;
  assign_::MAXIMUM_BOND_ORDER = DFT_ASSIGNELECTRON_MAX_BOND_ORDER;
  assign_::USE_ELECTRON_PAIRS = DFT_ASSIGNELECTRON_USE_PAIRS;
  assign_::AUTO_USE_ELECTRON_PAIRS = DFT_ASSIGNELECTRON_AUTO_USE_PAIRS;
  assign_::USE_CHARGED_BOND_ENERGIES = DFT_ASSIGNELECTRON_CHARGED_BONDS;
  assign_::ALLOWED_ELEMENTS.clear();
  assign_::ALLOWED_ELEMENTS = {DFT_ASSIGNELECTRON_ALLOWED_ELEMENTS};
  assign_::HIGHEST_MAGNITUDE_CHARGE = DFT_ASSIGNELECTRON_HIGHEST_CHARGE;
  assign_::ALLOW_CHARGED_CARBON = DFT_ASSIGNELECTRON_ALLOW_CHARGE_CARBON;
  assign_::MAXIMUM_RESULT_COUNT = DFT_ASSIGNELECTRON_MAX_RESULT;
  assign_::PREPLACE_ELECTRONS = DFT_ASSIGNELECTRON_PREPLACE;
  
  // Reset all sub options
  astar_::Reset();
  fpt_::Reset();
  lo_::Reset();
}